

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O0

int stable_grail_bin_search_left(int **arr,int len,int **key)

{
  int iVar1;
  int c;
  int b;
  int a;
  int **key_local;
  int len_local;
  int **arr_local;
  
  a = -1;
  b = len;
  iVar1 = a;
  while (a = iVar1, a < b + -1) {
    iVar1 = a + (b - a >> 1);
    if (-1 < *arr[iVar1] - **key) {
      b = iVar1;
      iVar1 = a;
    }
  }
  return b;
}

Assistant:

static int GRAIL_BIN_SEARCH_LEFT(SORT_TYPE *arr, int len, SORT_TYPE *key) {
  int a = -1, b = len, c;

  while (a < b - 1) {
    c = a + ((b - a) >> 1);

    if (SORT_CMP_A(arr + c, key) >= 0) {
      b = c;
    } else {
      a = c;
    }
  }

  return b;
}